

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O1

void add_source_fdtd_2D(source_type sType,fdtd2D *fdtd,fdtd_source src,float_type positionX,
                       float_type positionY)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  undefined8 in_RCX;
  code *extraout_RDX;
  double dVar6;
  uint uVar7;
  undefined4 in_register_0000003c;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  long lVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar20 [64];
  double dVar21;
  double dVar22;
  double dStack_b8;
  double dStack_b0;
  ulong uStack_30;
  
  auVar20._8_56_ = in_register_00001248;
  auVar20._0_8_ = positionY;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = positionX;
  pdVar8 = (double *)CONCAT44(in_register_0000003c,sType);
  auVar3 = vunpcklpd_avx(auVar19._0_16_,auVar20._0_16_);
  auVar16._0_8_ = fdtd->dx;
  auVar16._8_8_ = fdtd->dy;
  auVar16 = vdivpd_avx(auVar3,auVar16);
  auVar16 = vroundpd_avx(auVar16,9);
  auVar16 = vcvttpd2uqq_avx512vl(auVar16);
  if (auVar16._0_8_ < fdtd->sizeX) {
    uVar4 = vpextrq_avx(auVar16,1);
    if (uVar4 < fdtd->sizeY) {
      if (sType == source_electric) {
        lVar13 = 0xe8;
        lVar12 = 0xf0;
        lVar15 = 0xe0;
      }
      else {
        if (sType != source_magnetic) {
          return;
        }
        lVar13 = 0x100;
        lVar12 = 0x108;
        lVar15 = 0xf8;
      }
      uVar7 = *(int *)((long)fdtd->psi_hx_y + lVar15 + -0x40) + 1;
      *(uint *)((long)fdtd->psi_hx_y + lVar15 + -0x40) = uVar7;
      pvVar5 = realloc(*(void **)((long)fdtd->psi_hx_y + lVar12 + -0x40),(ulong)uVar7 << 4);
      *(void **)((long)fdtd->psi_hx_y + lVar12 + -0x40) = pvVar5;
      uVar7 = *(uint *)((long)fdtd->psi_hx_y + lVar15 + -0x40);
      uStack_30 = auVar16._8_8_;
      puVar1 = (ulong *)((long)pvVar5 + (ulong)(uVar7 - 1) * 0x10);
      *puVar1 = auVar16._0_8_;
      puVar1[1] = uStack_30;
      pvVar5 = realloc(*(void **)((long)fdtd->psi_hx_y + lVar13 + -0x40),(ulong)uVar7 << 5);
      *(void **)((long)fdtd->psi_hx_y + lVar13 + -0x40) = pvVar5;
      puVar2 = (undefined8 *)
               ((long)pvVar5 + (ulong)(*(int *)((long)fdtd->psi_hx_y + lVar15 + -0x40) - 1) * 0x20);
      *puVar2 = src._0_8_;
      puVar2[1] = src.field_1.field_0.gaussian_pulse_delay;
      puVar2[2] = src.field_1.field_0.gaussian_pulse_peak_time;
      puVar2[3] = src.field_1.field_0.gaussian_peak_val;
      return;
    }
  }
  else {
    add_source_fdtd_2D_cold_1();
  }
  add_source_fdtd_2D_cold_2();
  if (pdVar8[0x31] != 0.0) {
    dStack_b0 = pdVar8[10];
    dStack_b8 = pdVar8[0xb];
    lVar13 = (long)pdVar8[0x32] * (long)pdVar8[0x33] * 8;
    lVar12 = (long)pdVar8[0x33] * 8;
    dVar17 = 0.0;
    dVar6 = 0.0;
    do {
      if (pdVar8[0x32] != 0.0) {
        dVar22 = 0.0;
        dVar9 = 0.0;
        dVar10 = dStack_b8;
        dVar11 = dStack_b0;
        do {
          if (pdVar8[0x33] != 0.0) {
            dVar21 = 0.0;
            dVar14 = 0.0;
            do {
              dVar18 = (double)(*(code *)fdtd)(dVar17,dVar22,in_RCX);
              *(double *)((long)dVar10 + (long)dVar14 * 8) = 1.0 / (dVar18 * 1.2566370614359173e-06)
              ;
              dVar18 = (double)(*extraout_RDX)(dVar17,dVar22,dVar21,in_RCX);
              *(double *)((long)dVar11 + (long)dVar14 * 8) = 1.0 / (dVar18 * 8.85418781762039e-12);
              dVar14 = (double)((long)dVar14 + 1);
              dVar21 = dVar21 + pdVar8[2];
            } while ((ulong)dVar14 < (ulong)pdVar8[0x33]);
          }
          dVar9 = (double)((long)dVar9 + 1);
          dVar22 = dVar22 + pdVar8[1];
          dVar11 = (double)((long)dVar11 + lVar12);
          dVar10 = (double)((long)dVar10 + lVar12);
        } while ((ulong)dVar9 < (ulong)pdVar8[0x32]);
      }
      dVar6 = (double)((long)dVar6 + 1);
      dVar17 = dVar17 + *pdVar8;
      dStack_b0 = (double)((long)dStack_b0 + lVar13);
      dStack_b8 = (double)((long)dStack_b8 + lVar13);
    } while ((ulong)dVar6 < (ulong)pdVar8[0x31]);
  }
  return;
}

Assistant:

void add_source_fdtd_2D(enum source_type sType, struct fdtd2D *fdtd,
                        struct fdtd_source src, float_type positionX,
                        float_type positionY) {
  float_type posXf = floor(positionX / fdtd->dx);
  float_type posYf = floor(positionY / fdtd->dy);
  uintmax_t posX = (uintmax_t)posXf;
  uintmax_t posY = (uintmax_t)posYf;
  if (posX >= fdtd->sizeX) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the X "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  if (posY >= fdtd->sizeY) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the Y "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  switch (sType) {
  case source_electric: {
    fdtd->num_Jsources++;
    fdtd->JsourceLocations = realloc(
        fdtd->JsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Jsources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Jsources, 2, JsourceLocations,
                      fdtd->JsourceLocations);
    JsourceLocations[fdtd->num_Jsources - 1][0] = posX;
    JsourceLocations[fdtd->num_Jsources - 1][1] = posY;
    fdtd->Jsources =
        realloc(fdtd->Jsources, fdtd->num_Jsources * sizeof(*fdtd->Jsources));
    fdtd->Jsources[fdtd->num_Jsources - 1] = src;
    break;
  }
  case source_magnetic:
    fdtd->num_Msources++;
    fdtd->MsourceLocations = realloc(
        fdtd->MsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Msources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Msources, 2, MsourceLocations,
                      fdtd->MsourceLocations);
    MsourceLocations[fdtd->num_Msources - 1][0] = posX;
    MsourceLocations[fdtd->num_Msources - 1][1] = posY;
    fdtd->Msources =
        realloc(fdtd->Msources, fdtd->num_Msources * sizeof(*fdtd->Msources));
    fdtd->Msources[fdtd->num_Msources - 1] = src;
    break;
  }
}